

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int reparse_relative_location_path(ly_ctx *ctx,lyxp_expr *exp,uint16_t *exp_idx)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  uint16_t *exp_idx_local;
  lyxp_expr *exp_local;
  ly_ctx *ctx_local;
  
  iVar1 = exp_check_token(ctx,exp,*exp_idx,LYXP_TOKEN_NONE,1);
  do {
    if (iVar1 != 0) {
      return -1;
    }
    switch(exp->tokens[*exp_idx]) {
    case LYXP_TOKEN_DOT:
      *exp_idx = *exp_idx + 1;
      break;
    case LYXP_TOKEN_DDOT:
      *exp_idx = *exp_idx + 1;
      break;
    case LYXP_TOKEN_AT:
      *exp_idx = *exp_idx + 1;
      iVar1 = exp_check_token(ctx,exp,*exp_idx,LYXP_TOKEN_NONE,1);
      if (iVar1 != 0) {
        return -1;
      }
      if ((exp->tokens[*exp_idx] != LYXP_TOKEN_NAMETEST) &&
         (exp->tokens[*exp_idx] != LYXP_TOKEN_NODETYPE)) {
        pcVar2 = print_token(exp->tokens[*exp_idx]);
        ly_vlog(ctx,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar2,
                exp->expr + exp->expr_pos[*exp_idx]);
        return -1;
      }
    case LYXP_TOKEN_NAMETEST:
      *exp_idx = *exp_idx + 1;
      goto LAB_001b3900;
    default:
      pcVar2 = print_token(exp->tokens[*exp_idx]);
      ly_vlog(ctx,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar2,
              exp->expr + exp->expr_pos[*exp_idx]);
      return -1;
    case LYXP_TOKEN_NODETYPE:
      *exp_idx = *exp_idx + 1;
      iVar1 = exp_check_token(ctx,exp,*exp_idx,LYXP_TOKEN_PAR1,1);
      if (iVar1 != 0) {
        return -1;
      }
      *exp_idx = *exp_idx + 1;
      iVar1 = exp_check_token(ctx,exp,*exp_idx,LYXP_TOKEN_PAR2,1);
      if (iVar1 != 0) {
        return -1;
      }
      *exp_idx = *exp_idx + 1;
LAB_001b3900:
      while( true ) {
        bVar3 = false;
        if (*exp_idx < exp->used) {
          bVar3 = exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1;
        }
        if (!bVar3) break;
        iVar1 = reparse_predicate(ctx,exp,exp_idx);
        if (iVar1 != 0) {
          return -1;
        }
      }
    }
    bVar3 = false;
    if (*exp_idx < exp->used) {
      bVar3 = exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH;
    }
    if (!bVar3) {
      return 0;
    }
    *exp_idx = *exp_idx + 1;
    iVar1 = exp_check_token(ctx,exp,*exp_idx,LYXP_TOKEN_NONE,1);
  } while( true );
}

Assistant:

static int
reparse_relative_location_path(struct ly_ctx *ctx, struct lyxp_expr *exp, uint16_t *exp_idx)
{
    if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_NONE, 1)) {
        return -1;
    }

    goto step;
    do {
        /* '/' or '//' */
        ++(*exp_idx);

        if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_NONE, 1)) {
            return -1;
        }
step:
        /* Step */
        switch (exp->tokens[*exp_idx]) {
        case LYXP_TOKEN_DOT:
            ++(*exp_idx);
            break;

        case LYXP_TOKEN_DDOT:
            ++(*exp_idx);
            break;

        case LYXP_TOKEN_AT:
            ++(*exp_idx);

            if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_NONE, 1)) {
                return -1;
            }
            if ((exp->tokens[*exp_idx] != LYXP_TOKEN_NAMETEST) && (exp->tokens[*exp_idx] != LYXP_TOKEN_NODETYPE)) {
                LOGVAL(ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
                       print_token(exp->tokens[*exp_idx]), &exp->expr[exp->expr_pos[*exp_idx]]);
                return -1;
            }
            /* fall through */
        case LYXP_TOKEN_NAMETEST:
            ++(*exp_idx);
            goto reparse_predicate;
            break;

        case LYXP_TOKEN_NODETYPE:
            ++(*exp_idx);

            /* '(' */
            if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_PAR1, 1)) {
                return -1;
            }
            ++(*exp_idx);

            /* ')' */
            if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_PAR2, 1)) {
                return -1;
            }
            ++(*exp_idx);

reparse_predicate:
            /* Predicate* */
            while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1)) {
                if (reparse_predicate(ctx, exp, exp_idx)) {
                    return -1;
                }
            }
            break;
        default:
            LOGVAL(ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
                   print_token(exp->tokens[*exp_idx]), &exp->expr[exp->expr_pos[*exp_idx]]);
            return -1;
        }
    } while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH));

    return EXIT_SUCCESS;
}